

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

_binbuf * glist_writetobinbuf(_glist *x,int wholething)

{
  t_dataslot *ptVar1;
  undefined8 uVar2;
  _glist *x_00;
  t_symbol **pptVar3;
  int iVar4;
  int iVar5;
  _binbuf *x_01;
  t_symbol *ptVar6;
  t_template *ptVar7;
  t_symbol *ptVar8;
  ulong uVar9;
  t_gobj *ptVar10;
  ulong uVar11;
  long lVar12;
  int ntemplates;
  t_symbol **templatevec;
  uint local_6c;
  t_symbol **local_68;
  int local_5c;
  ulong local_58;
  _glist *local_50;
  ulong local_48;
  t_symbol **local_40;
  ulong local_38;
  
  uVar11 = 0;
  local_68 = (t_symbol **)getbytes(0);
  local_6c = 0;
  x_01 = binbuf_new();
  ptVar10 = x->gl_list;
  if (ptVar10 != (t_gobj *)0x0) {
    do {
      if ((ptVar10->g_pd == scalar_class) &&
         ((wholething != 0 || (iVar4 = glist_isselected(x,ptVar10), iVar4 != 0)))) {
        canvas_addtemplatesforscalar
                  ((t_symbol *)ptVar10[1].g_pd,(t_word *)&ptVar10[1].g_next,(int *)&local_6c,
                   &local_68);
      }
      ptVar10 = ptVar10->g_next;
    } while (ptVar10 != (_gobj *)0x0);
    uVar11 = (ulong)local_6c;
  }
  local_5c = wholething;
  local_50 = x;
  ptVar6 = gensym("data");
  binbuf_addv(x_01,"s;",ptVar6);
  local_58 = uVar11;
  if (0 < (int)uVar11) {
    local_40 = local_68;
    uVar9 = 0;
    local_48 = uVar11;
    do {
      pptVar3 = local_40;
      ptVar7 = template_findbyname(local_40[uVar9]);
      iVar4 = ptVar7->t_n;
      ptVar6 = gensym("template");
      local_38 = uVar9;
      gensym(pptVar3[uVar9]->s_name + 3);
      binbuf_addv(x_01,"ss;",ptVar6);
      if (0 < (long)iVar4) {
        lVar12 = 0;
        do {
          ptVar6 = &s_float;
          switch(*(undefined4 *)((long)&ptVar7->t_vec->ds_type + lVar12)) {
          case 0:
            break;
          case 1:
            ptVar6 = &s_symbol;
            break;
          case 2:
            ptVar6 = &s_list;
            break;
          case 3:
            ptVar6 = gensym("array");
            break;
          default:
            bug("canvas_write");
            ptVar6 = &s_float;
          }
          ptVar1 = ptVar7->t_vec;
          uVar2 = *(undefined8 *)((long)&ptVar1->ds_name + lVar12);
          if (*(int *)((long)&ptVar1->ds_type + lVar12) == 3) {
            ptVar8 = gensym((char *)(**(long **)((long)&ptVar1->ds_arraytemplate + lVar12) + 3));
            binbuf_addv(x_01,"sss;",ptVar6,uVar2,ptVar8);
          }
          else {
            binbuf_addv(x_01,"ss;",ptVar6);
          }
          lVar12 = lVar12 + 0x18;
        } while ((long)iVar4 * 0x18 != lVar12);
      }
      binbuf_addsemi(x_01);
      uVar9 = local_38 + 1;
    } while (uVar9 != local_48);
  }
  binbuf_addsemi(x_01);
  x_00 = local_50;
  iVar4 = local_5c;
  for (ptVar10 = local_50->gl_list; ptVar10 != (t_gobj *)0x0; ptVar10 = ptVar10->g_next) {
    if ((ptVar10->g_pd == scalar_class) &&
       ((iVar4 != 0 || (iVar5 = glist_isselected(x_00,ptVar10), iVar5 != 0)))) {
      canvas_writescalar((t_symbol *)ptVar10[1].g_pd,(t_word *)&ptVar10[1].g_next,x_01,0);
    }
  }
  freebytes(local_68,(long)(int)local_58 << 3);
  return x_01;
}

Assistant:

t_binbuf *glist_writetobinbuf(t_glist *x, int wholething)
{
    int i;
    t_symbol **templatevec = getbytes(0);
    int ntemplates = 0;
    t_gobj *y;
    t_binbuf *b = binbuf_new();

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  &ntemplates, &templatevec);
        }
    }
    binbuf_addv(b, "s;", gensym("data"));
    for (i = 0; i < ntemplates; i++)
    {
        t_template *template = template_findbyname(templatevec[i]);
        int j, m = template->t_n;
            /* drop "pd-" prefix from template symbol to print it: */
        binbuf_addv(b, "ss;", gensym("template"),
            gensym(templatevec[i]->s_name + 3));
        for (j = 0; j < m; j++)
        {
            t_symbol *type;
            switch (template->t_vec[j].ds_type)
            {
                case DT_FLOAT: type = &s_float; break;
                case DT_SYMBOL: type = &s_symbol; break;
                case DT_ARRAY: type = gensym("array"); break;
                case DT_TEXT: type = &s_list; break;
                default: type = &s_float; bug("canvas_write");
            }
            if (template->t_vec[j].ds_type == DT_ARRAY)
                binbuf_addv(b, "sss;", type, template->t_vec[j].ds_name,
                    gensym(template->t_vec[j].ds_arraytemplate->s_name + 3));
            else binbuf_addv(b, "ss;", type, template->t_vec[j].ds_name);
        }
        binbuf_addsemi(b);
    }
    binbuf_addsemi(b);
        /* now write out the objects themselves */
    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_writescalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  b, 0);
        }
    }
    t_freebytes(templatevec, ntemplates*sizeof(*templatevec));
    return (b);
}